

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O3

void anon_unknown.dwarf_9b569f::noise_synth
               (ACMRandom *random,int lag,int n,int (*coords) [2],double *coeffs,double *data,int w,
               int h)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  double *__dest;
  undefined4 in_register_00000034;
  long lVar5;
  int iVar6;
  long lVar7;
  pointer __src;
  double dVar8;
  vector<double,_std::allocator<double>_> padded;
  ulong local_90;
  allocator_type local_85;
  uint local_84;
  double *local_80;
  ulong local_78;
  undefined8 local_70;
  long local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  local_70 = CONCAT44(in_register_00000034,lag);
  uVar1 = lag * 3 + w;
  uVar2 = lag * 3 + h;
  uVar3 = (ulong)uVar2;
  local_84 = n;
  local_80 = data;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_48,(long)(int)(uVar2 * uVar1),&local_85);
  local_78 = uVar3;
  if (0 < (int)uVar2) {
    local_58 = (ulong)uVar1;
    local_68 = local_58 * 8;
    lVar4 = 0;
    local_90 = 0;
    local_60 = uVar3;
    do {
      uVar3 = local_58;
      local_50 = lVar4;
      if (0 < (int)uVar1) {
        do {
          dVar8 = randn(random,1.0);
          *(double *)
           ((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar4) = dVar8;
          lVar4 = lVar4 + 8;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      local_90 = local_90 + 1;
      lVar4 = local_50 + local_68;
    } while (local_90 != local_60);
  }
  lVar4 = (long)(int)uVar1;
  iVar6 = (int)local_70;
  if (iVar6 < (int)local_78) {
    lVar5 = (long)iVar6;
    do {
      if (iVar6 < (int)uVar1) {
        lVar7 = (long)iVar6;
        do {
          dVar8 = 0.0;
          if (0 < (int)local_84) {
            uVar3 = 0;
            do {
              dVar8 = dVar8 + local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start
                              [(int)(coords[uVar3][0] + (int)lVar7 +
                                    (coords[uVar3][1] + (int)lVar5) * uVar1)] * coeffs[uVar3];
              uVar3 = uVar3 + 1;
            } while (local_84 != uVar3);
          }
          local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5 * lVar4 + lVar7] =
               dVar8 + local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar5 * lVar4 + lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != lVar4);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != (int)local_78);
  }
  if (0 < h) {
    uVar3 = (ulong)(uint)h;
    __dest = local_80;
    __src = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
    do {
      memcpy(__dest,__src,(ulong)(uint)w << 3);
      __src = __src + lVar4;
      __dest = __dest + w;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void noise_synth(libaom_test::ACMRandom *random, int lag, int n,
                 const int (*coords)[2], const double *coeffs, double *data,
                 int w, int h) {
  const int pad_size = 3 * lag;
  const int padded_w = w + pad_size;
  const int padded_h = h + pad_size;
  int x = 0, y = 0;
  std::vector<double> padded(padded_w * padded_h);

  for (y = 0; y < padded_h; ++y) {
    for (x = 0; x < padded_w; ++x) {
      padded[y * padded_w + x] = randn(random, 1.0);
    }
  }
  for (y = lag; y < padded_h; ++y) {
    for (x = lag; x < padded_w; ++x) {
      double sum = 0;
      int i = 0;
      for (i = 0; i < n; ++i) {
        const int dx = coords[i][0];
        const int dy = coords[i][1];
        sum += padded[(y + dy) * padded_w + (x + dx)] * coeffs[i];
      }
      padded[y * padded_w + x] += sum;
    }
  }
  // Copy over the padded rows to the output
  for (y = 0; y < h; ++y) {
    memcpy(data + y * w, &padded[0] + y * padded_w, sizeof(*data) * w);
  }
}